

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArraySegment.cpp
# Opt level: O3

void Js::SparseArraySegmentBase::EnsureSizeInBound
               (uint32 left,uint32 length,uint32 *size,SparseArraySegmentBase *next)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint uVar5;
  Type TVar6;
  
  if (next == (SparseArraySegmentBase *)0x0) {
    TVar6 = 0xffffffff;
  }
  else {
    TVar6 = next->left;
  }
  uVar5 = TVar6 - left;
  if (TVar6 < left || uVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                ,0x19,"(nextLeft > left)","nextLeft > left");
    if (!bVar3) goto LAB_00d4d78e;
    *puVar4 = 0;
  }
  uVar1 = *size;
  if (uVar1 == 0) {
    uVar5 = 0;
  }
  else {
    if (uVar1 < uVar5) {
      uVar5 = uVar1;
    }
    *size = uVar5;
  }
  if (uVar5 < length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                ,0x21,"(length <= size)","length <= size");
    if (!bVar3) {
LAB_00d4d78e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void SparseArraySegmentBase::EnsureSizeInBound(uint32 left, uint32 length, uint32& size, SparseArraySegmentBase* next)
    {
        uint32 nextLeft = next ? next->left : JavascriptArray::MaxArrayLength;
        Assert(nextLeft > left);

        if(size != 0)
        {
            // Avoid writing to 'size' for an empty segment. The empty segment is a constant structure and writing to it (even
            // if it's not being changed) may cause an AV.
            size = min(size, nextLeft - left);
        }
        AssertOrFailFast(length <= size);
    }